

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iutest_genparams.hpp
# Opt level: O0

iuIParamGenerator<int> * __thiscall
iutest::detail::iuRandomParamsHolder::operator_cast_to_iuIParamGenerator_
          (iuRandomParamsHolder *this)

{
  size_t num;
  iuIParamGenerator<int> *piVar1;
  iuTypedRandom<int> local_40;
  undefined1 local_30 [8];
  iuValuesParamsGeneratorHolder<iutest::detail::iuTypedRandom<int>_> gen;
  uint seed;
  iuRandomParamsHolder *this_local;
  
  gen.m_g.m_rnd.m_engine.m_v4 = this->m_seed;
  if (gen.m_g.m_rnd.m_engine.m_v4 == 0) {
    gen.m_g.m_rnd.m_engine.m_v4 = GetIndefiniteValue();
  }
  num = this->m_num;
  iuTypedRandom<int>::iuTypedRandom(&local_40,gen.m_g.m_rnd.m_engine.m_v4);
  iuValuesParamsGeneratorHolder<iutest::detail::iuTypedRandom<int>_>::iuValuesParamsGeneratorHolder
            ((iuValuesParamsGeneratorHolder<iutest::detail::iuTypedRandom<int>_> *)local_30,num,
             &local_40);
  piVar1 = iuValuesParamsGeneratorHolder::operator_cast_to_iuIParamGenerator_
                     ((iuValuesParamsGeneratorHolder *)local_30);
  return piVar1;
}

Assistant:

operator iuIParamGenerator<T>* () const
    {
        unsigned int seed = m_seed;
        if( seed == 0 )
        {
            seed = GetIndefiniteValue();
        }
        iuValuesParamsGeneratorHolder< iuTypedRandom<T> > gen( m_num, iuTypedRandom<T>(seed) );
        return gen;
    }